

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

void __thiscall ON_Layer::~ON_Layer(ON_Layer *this)

{
  ON_LayerPrivate *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_008213b0;
  pOVar1 = this->m_private;
  if (pOVar1 != (ON_LayerPrivate *)0x0) {
    this_00 = (pOVar1->m_custom_section_style).
              super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    operator_delete(pOVar1,0x18);
  }
  ON_ClassArray<ON_MaterialRef>::~ON_ClassArray(&(this->m_rendering_attributes).m_materials);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00823f80;
  ON_wString::~ON_wString(&(this->super_ON_ModelComponent).m_component_name);
  ON_Object::~ON_Object((ON_Object *)this);
  return;
}

Assistant:

ON_Layer::~ON_Layer()
{
  if (m_private)
    delete m_private;
}